

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O2

void rest_engravings(memfile *mf,level *lev)

{
  engr *peVar1;
  int8_t iVar2;
  uint len;
  engr *peVar3;
  char *pcVar4;
  engr *peVar5;
  
  mfmagic_check(mf,0x52474e45);
  lev->lev_engr = (engr *)0x0;
  while( true ) {
    len = mread32(mf);
    if (len == 0) {
      peVar3 = (engr *)0x0;
      peVar5 = lev->lev_engr;
      while (peVar5 != (engr *)0x0) {
        peVar1 = peVar5->nxt_engr;
        peVar5->nxt_engr = peVar3;
        peVar3 = peVar5;
        peVar5 = peVar1;
      }
      lev->lev_engr = peVar3;
      return;
    }
    if (0x100 < len) break;
    peVar3 = (engr *)malloc((ulong)len + 0x28);
    peVar3->engr_lth = len;
    iVar2 = mread8(mf);
    peVar3->engr_x = iVar2;
    iVar2 = mread8(mf);
    peVar3->engr_y = iVar2;
    iVar2 = mread8(mf);
    peVar3->engr_type = iVar2;
    peVar3->engr_txt = (char *)(peVar3 + 1);
    mread(mf,peVar3 + 1,len);
    peVar3->nxt_engr = lev->lev_engr;
    lev->lev_engr = peVar3;
    pcVar4 = peVar3->engr_txt;
    while (*pcVar4 == ' ') {
      peVar3->engr_txt = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
    }
    peVar3->engr_time = (ulong)moves;
  }
  panic("rest_engravings: engraving length too long! (%d)",(ulong)len);
}

Assistant:

void rest_engravings(struct memfile *mf, struct level *lev)
{
	struct engr *ep, *eprev, *enext;
	unsigned lth;

	mfmagic_check(mf, ENGRAVE_MAGIC);
	lev->lev_engr = NULL;
	while (1) {
		lth = mread32(mf);
		if (!lth) /* no more engravings */
		    break;
		if (lth > BUFSZ)
		    panic("rest_engravings: engraving length too long! (%d)", lth);

		ep = newengr(lth);
		ep->engr_lth = lth;
		ep->engr_x = mread8(mf);
		ep->engr_y = mread8(mf);
		ep->engr_type = mread8(mf);
		ep->engr_txt = (char *)(ep + 1);
		mread(mf, ep->engr_txt, lth);

		ep->nxt_engr = lev->lev_engr;
		lev->lev_engr = ep;
		while (ep->engr_txt[0] == ' ')
		    ep->engr_txt++;
		/* mark as finished for bones levels -- no problem for
		 * normal levels as the player must have finished engraving
		 * to be able to move again */
		ep->engr_time = moves;
	}

	/* engravings loaded above are reversed, so put it back in the right order */
	ep = lev->lev_engr;
	eprev = NULL;
	while (ep) {
		enext = ep->nxt_engr;
		ep->nxt_engr = eprev;
		eprev = ep;
		ep = enext;
	}
	lev->lev_engr = eprev;
}